

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int write_skip(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,MB_MODE_INFO *mi,aom_writer *w)

{
  aom_cdf_prob *paVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  FRAME_CONTEXT *pFVar5;
  short sVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  aom_cdf_prob (*icdf) [3];
  
  if (((cm->seg).enabled == '\0') || (uVar11 = 1, ((cm->seg).feature_mask[segment_id] & 0x40) == 0))
  {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)xd->above_mbmi->skip_txfm;
    }
    bVar2 = mi->skip_txfm;
    uVar11 = (uint)bVar2;
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)xd->left_mbmi->skip_txfm;
    }
    lVar10 = uVar9 + uVar7;
    pFVar5 = xd->tile_ctx;
    icdf = pFVar5->skip_txfm_cdfs + lVar10;
    od_ec_encode_cdf_q15(&w->ec,(uint)bVar2,*icdf,2);
    if (w->allow_update_cdf != '\0') {
      uVar3 = pFVar5->skip_txfm_cdfs[lVar10][2];
      bVar8 = (char)(uVar3 >> 4) + 4;
      uVar4 = (*icdf)[0];
      if ((char)bVar2 < '\x01') {
        sVar6 = -(uVar4 >> (bVar8 & 0x1f));
      }
      else {
        sVar6 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar8 & 0x1f));
      }
      (*icdf)[0] = sVar6 + uVar4;
      paVar1 = pFVar5->skip_txfm_cdfs[lVar10] + 2;
      *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
    }
  }
  return uVar11;
}

Assistant:

static int write_skip(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      uint8_t segment_id, const MB_MODE_INFO *mi,
                      aom_writer *w) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int skip_txfm = mi->skip_txfm;
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    aom_write_symbol(w, skip_txfm, ec_ctx->skip_txfm_cdfs[ctx], 2);
    return skip_txfm;
  }
}